

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_reader.cpp
# Opt level: O3

void __thiscall
charls::jpeg_stream_reader::add_component(jpeg_stream_reader *this,uint8_t component_id)

{
  pointer *ppuVar1;
  iterator __position;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var2;
  uchar local_9;
  
  local_9 = component_id;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_char_const>>
                    ((this->component_ids_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (this->component_ids_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish);
  __position._M_current =
       (this->component_ids_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current == __position._M_current) {
    if (_Var2._M_current ==
        (this->component_ids_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      _M_realloc_insert<unsigned_char_const&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->component_ids_,
                 __position,&local_9);
    }
    else {
      *__position._M_current = local_9;
      ppuVar1 = &(this->component_ids_).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    return;
  }
  add_component();
}

Assistant:

void jpeg_stream_reader::add_component(const uint8_t component_id)
{
    if (UNLIKELY(find(component_ids_.cbegin(), component_ids_.cend(), component_id) != component_ids_.cend()))
        throw_jpegls_error(jpegls_errc::duplicate_component_id_in_sof_segment);

    component_ids_.push_back(component_id);
}